

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O0

void Fraig_CollectSupergate_rec
               (Fraig_Node_t *pNode,Fraig_NodeVec_t *vSuper,int fFirst,int fStopAtMux)

{
  int iVar1;
  int fStopAtMux_local;
  int fFirst_local;
  Fraig_NodeVec_t *vSuper_local;
  Fraig_Node_t *pNode_local;
  
  if ((((fFirst != 0) || (*(int *)(((ulong)pNode & 0xfffffffffffffffe) + 0xc) < 2)) &&
      (((ulong)pNode & 1) == 0)) &&
     ((iVar1 = Fraig_NodeIsVar(pNode), iVar1 == 0 &&
      ((fStopAtMux == 0 || (iVar1 = Fraig_NodeIsMuxType(pNode), iVar1 == 0)))))) {
    Fraig_CollectSupergate_rec(pNode->p1,vSuper,0,fStopAtMux);
    Fraig_CollectSupergate_rec(pNode->p2,vSuper,0,fStopAtMux);
    return;
  }
  Fraig_NodeVecPushUnique(vSuper,pNode);
  return;
}

Assistant:

void Fraig_CollectSupergate_rec( Fraig_Node_t * pNode, Fraig_NodeVec_t * vSuper, int fFirst, int fStopAtMux )
{
    // if the new node is complemented or a PI, another gate begins
//    if ( Fraig_IsComplement(pNode) || Fraig_NodeIsVar(pNode) || Fraig_NodeIsMuxType(pNode) )
    if ( (!fFirst && Fraig_Regular(pNode)->nRefs > 1) || 
          Fraig_IsComplement(pNode) || Fraig_NodeIsVar(pNode) || 
          (fStopAtMux && Fraig_NodeIsMuxType(pNode)) )
    {
        Fraig_NodeVecPushUnique( vSuper, pNode );
        return;
    }
    // go through the branches
    Fraig_CollectSupergate_rec( pNode->p1, vSuper, 0, fStopAtMux );
    Fraig_CollectSupergate_rec( pNode->p2, vSuper, 0, fStopAtMux );
}